

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxArrayElement::Emit(FxArrayElement *this,VMFunctionBuilder *build)

{
  BYTE BVar1;
  uint val;
  PString *pPVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  PType *pPVar7;
  uint extraout_var;
  uint extraout_var_00;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  FScriptPosition *other;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  uint local_70;
  ulong local_68;
  ulong local_60;
  uint local_54;
  ulong local_50;
  FString local_40;
  ulong local_38;
  
  pPVar7 = (PType *)&this->Array->ValueType;
  if (this->arrayispointer == true) {
    pPVar7 = *(PType **)pPVar7 + 1;
  }
  pPVar7 = (PType *)(pPVar7->super_PTypeBase).super_DObject._vptr_DObject;
  local_70 = (*this->Array->_vptr_FxExpression[9])(this->Array,build);
  uVar8 = CONCAT44(extraout_var,local_70);
  uVar11 = uVar8 >> 0x10;
  uVar12 = uVar8 >> 0x18;
  local_68 = (ulong)extraout_var;
  uVar5 = extraout_var >> 8;
  iVar3 = (*this->index->_vptr_FxExpression[3])();
  bVar9 = (byte)(local_70 >> 0x10);
  local_60._0_1_ = (byte)(extraout_var >> 8);
  if ((char)iVar3 == '\0') {
    uVar4 = (*this->index->_vptr_FxExpression[9])(this->index,build);
    uVar12 = CONCAT44(extraout_var_00,uVar4);
    uVar6 = *(uint *)&pPVar7[1].super_PTypeBase.super_DObject.Class;
    iVar3 = 0x54;
    if (0xffff < uVar6) {
      uVar6 = VMFunctionBuilder::GetConstantInt(build,uVar6);
      iVar3 = 0x55;
    }
    VMFunctionBuilder::Emit(build,iVar3,uVar4 & 0xffff,(VM_SHALF)uVar6);
    local_54 = (uint)(uVar12 >> 0x18);
    if ((extraout_var & 1) != 0) {
      if (((this->super_FxExpression).ValueType)->RegType != bVar9) {
        __assert_fail("start.RegType == ValueType->GetRegType()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0x1ae5,"virtual ExpEmit FxArrayElement::Emit(VMFunctionBuilder *)");
      }
      uVar5 = VMFunctionBuilder::RegAvailability::Get
                        (build->Registers + (((ulong)local_70 & 0xff0000) >> 0x10),1);
      uVar6 = local_70 & 0xffff;
      if ((local_70 & 0xffff) < 0x100) {
        iVar3 = Emit::LKR_Ops[((ulong)local_70 & 0xff0000) >> 0x10];
      }
      else {
        uVar6 = VMFunctionBuilder::GetConstantInt(build,uVar6);
        VMFunctionBuilder::Emit(build,100,uVar4 & 0xffff,uVar4 & 0xffff,uVar6);
        iVar3 = Emit::LKR_Ops[((ulong)local_70 & 0xff0000) >> 0x10];
        uVar6 = 0;
      }
      VMFunctionBuilder::Emit(build,iVar3,uVar5 & 0xffff,uVar4 & 0xffff,uVar6);
      if (((extraout_var_00 & 0x100) == 0) &&
         ((byte)(uVar4 >> 0x10) < 4 && (extraout_var_00 & 1) == 0)) {
        VMFunctionBuilder::RegAvailability::Return
                  (build->Registers + ((uint)(uVar12 >> 0x10) & 3),uVar4 & 0xffff,local_54 & 0xff);
      }
      goto LAB_00534c38;
    }
    uVar6 = *(uint *)((long)&pPVar7[1].super_PTypeBase.super_DObject.Class + 4);
    iVar3 = -1;
    do {
      iVar3 = iVar3 + 1;
      uVar10 = 1 << ((byte)iVar3 & 0x1f);
    } while (uVar10 < uVar6);
    local_38 = uVar11;
    if ((uVar6 < 2) || ((extraout_var_00 & 0x100) == 0)) {
      uVar12 = (ulong)uVar4 & 0xffff0000;
      local_54 = local_54 & 0xff;
      bVar14 = (extraout_var_00 & 0x101) == 0;
      uVar6 = uVar4;
    }
    else {
      local_54 = 1;
      uVar6 = VMFunctionBuilder::RegAvailability::Get
                        (build->Registers + (((ulong)uVar4 & 0xff0000) >> 0x10),1);
      bVar14 = true;
    }
    uVar11 = local_38;
    local_50 = uVar12 >> 0x10;
    val = *(uint *)((long)&pPVar7[1].super_PTypeBase.super_DObject.Class + 4);
    uVar6 = uVar6 & 0xffff;
    if (uVar10 == val) {
      if (iVar3 != 0) {
        VMFunctionBuilder::Emit(build,0x5b,uVar6,uVar4 & 0xffff,iVar3);
      }
    }
    else {
      uVar10 = VMFunctionBuilder::GetConstantInt(build,val);
      VMFunctionBuilder::Emit(build,0x6a,uVar6,uVar4 & 0xffff,uVar10);
      uVar11 = local_38;
    }
    if ((bool)(bVar14 & (byte)(uVar12 >> 0x10) < 4)) {
      VMFunctionBuilder::RegAvailability::Return
                (build->Registers + (local_50 & 0xff),uVar6,local_54);
    }
    if (this->AddressRequested != true) {
      if ((byte)uVar11 < 4 && (((byte)local_60 | (byte)extraout_var) & 1) == 0) {
        VMFunctionBuilder::RegAvailability::Return
                  (build->Registers + ((uint)uVar11 & 3),local_70 & 0xffff,local_70 >> 0x18);
      }
      uVar11 = (ulong)((this->super_FxExpression).ValueType)->RegType;
      uVar5 = VMFunctionBuilder::RegAvailability::Get(build->Registers + uVar11,1);
      uVar4 = *(byte *)(pPVar7[1].super_PTypeBase.super_DObject._vptr_DObject + 0xd) + 1;
      goto LAB_00534c2d;
    }
    if ((uVar5 & 1) == 0) {
      VMFunctionBuilder::Emit(build,0xcc,local_70 & 0xffff,local_70 & 0xffff,uVar6);
      uVar12 = uVar8;
    }
    else {
      uVar5 = VMFunctionBuilder::RegAvailability::Get(build->Registers + (uVar11 & 0xff),1);
      VMFunctionBuilder::Emit(build,0xcc,uVar5 & 0xffff,local_70 & 0xffff,uVar6);
      uVar8 = (ulong)uVar5;
      uVar12 = 0x1000000;
    }
    uVar5 = (uint)uVar8;
    uVar8 = uVar12 & 0xffffffff00000000;
  }
  else {
    pPVar2 = (PString *)this->index[1]._vptr_FxExpression;
    other = &this->index[1].ScriptPosition;
    if (pPVar2 == TypeString) {
      FString::AttachToOther(&local_40,&other->FileName);
    }
    else {
      local_40.Chars = (other->FileName).Chars;
    }
    BVar1 = (pPVar2->super_PBasicType).super_PType.RegType;
    if (BVar1 == '\x01') {
      uVar6 = (uint)(double)local_40.Chars;
    }
    else {
      uVar6 = 0;
      if (BVar1 == '\0') {
        uVar6 = (uint)local_40.Chars;
      }
    }
    if (pPVar2 == TypeString) {
      FString::~FString(&local_40);
    }
    if (*(uint *)&pPVar7[1].super_PTypeBase.super_DObject.Class <= uVar6) {
      __assert_fail("indexval < arraytype->ElementCount && \"Array index out of bounds\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x1a7f,"virtual ExpEmit FxArrayElement::Emit(VMFunctionBuilder *)");
    }
    if (this->AddressRequested != true) {
      if ((extraout_var & 1) == 0) {
        if (bVar9 < 4 && (uVar5 & 1) == 0) {
          VMFunctionBuilder::RegAvailability::Return
                    (build->Registers + ((uint)(uVar8 >> 0x10) & 3),local_70 & 0xffff,
                     local_70 >> 0x18);
        }
        uVar11 = (ulong)((this->super_FxExpression).ValueType)->RegType;
        uVar5 = VMFunctionBuilder::RegAvailability::Get(build->Registers + uVar11,1);
        uVar4 = (uint)*(byte *)(pPVar7[1].super_PTypeBase.super_DObject._vptr_DObject + 0xd);
        uVar6 = VMFunctionBuilder::GetConstantInt
                          (build,uVar6 * *(int *)((long)&pPVar7[1].super_PTypeBase.super_DObject.
                                                         Class + 4));
LAB_00534c2d:
        VMFunctionBuilder::Emit(build,uVar4,uVar5 & 0xffff,local_70 & 0xffff,uVar6);
      }
      else {
        if (((this->super_FxExpression).ValueType)->RegType != bVar9) {
          __assert_fail("start.RegType == ValueType->GetRegType()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                        ,0x1a9f,"virtual ExpEmit FxArrayElement::Emit(VMFunctionBuilder *)");
        }
        uVar12 = ((ulong)local_70 & 0xff0000) >> 0x10;
        uVar5 = VMFunctionBuilder::RegAvailability::Get(build->Registers + uVar12,1);
        VMFunctionBuilder::Emit
                  (build,Emit::LK_Ops[uVar12],uVar5 & 0xffff,(short)uVar6 + (short)local_70);
      }
LAB_00534c38:
      uVar6 = (uint)uVar11;
      uVar4 = 0x1000000;
      uVar8 = 0;
      goto LAB_00534cba;
    }
    uVar13 = (ulong)(extraout_var >> 0x10);
    local_60 = (ulong)uVar5;
    if (uVar6 != 0) {
      iVar3 = uVar6 * *(int *)((long)&pPVar7[1].super_PTypeBase.super_DObject.Class + 4);
      if ((uVar5 & 1) == 0) {
        local_70 = local_70 & 0xffff;
        uVar5 = VMFunctionBuilder::GetConstantInt(build,iVar3);
        VMFunctionBuilder::Emit(build,0xcd,local_70,local_70,uVar5);
      }
      else {
        uVar5 = VMFunctionBuilder::RegAvailability::Get
                          (build->Registers + (((ulong)local_70 & 0xff0000) >> 0x10),1);
        uVar6 = VMFunctionBuilder::GetConstantInt(build,iVar3);
        VMFunctionBuilder::Emit(build,0xcd,uVar5 & 0xffff,local_70 & 0xffff,uVar6);
        uVar8 = (ulong)uVar5;
        uVar12 = 1;
        local_68 = 0;
        local_60 = 0;
        uVar13 = 0;
      }
    }
    uVar5 = (uint)uVar8;
    uVar8 = (local_68 & 0xff) << 0x20 | (local_60 & 0xff) << 0x28 | uVar13 << 0x30;
    uVar12 = uVar12 << 0x18;
  }
  uVar6 = (uint)uVar11;
  uVar4 = (uint)uVar12;
LAB_00534cba:
  return (ExpEmit)((ulong)(uVar5 & 0xffff | uVar4 & 0xff000000) | (uVar6 & 0xff) << 0x10 | uVar8);
}

Assistant:

ExpEmit FxArrayElement::Emit(VMFunctionBuilder *build)
{
	PArray *arraytype;
	
	if (arrayispointer)
	{
		arraytype = static_cast<PArray*>(static_cast<PPointer*>(Array->ValueType)->PointedType);
	}
	else
	{
		arraytype = static_cast<PArray*>(Array->ValueType);
	}
	ExpEmit start = Array->Emit(build);

	/* what was this for?
	if (start.Konst)
	{
		ExpEmit tmpstart(build, REGT_POINTER);
		build->Emit(OP_LKP, tmpstart.RegNum, start.RegNum);
		start.Free(build);
		start = tmpstart;
	}
	*/
	if (index->isConstant())
	{
		unsigned indexval = static_cast<FxConstant *>(index)->GetValue().GetInt();
		assert(indexval < arraytype->ElementCount && "Array index out of bounds");

		if (AddressRequested)
		{
			if (indexval != 0)
			{
				indexval *= arraytype->ElementSize;
				if (!start.Fixed)
				{
					build->Emit(OP_ADDA_RK, start.RegNum, start.RegNum, build->GetConstantInt(indexval));
				}
				else
				{
					// do not clobber local variables.
					ExpEmit temp(build, start.RegType);
					build->Emit(OP_ADDA_RK, temp.RegNum, start.RegNum, build->GetConstantInt(indexval));
					start.Free(build);
					start = temp;
				}
			}
			return start;
		}
		else if (!start.Konst)
		{
			start.Free(build);
			ExpEmit dest(build, ValueType->GetRegType());
			build->Emit(arraytype->ElementType->GetLoadOp(), dest.RegNum, start.RegNum, build->GetConstantInt(indexval* arraytype->ElementSize));
			return dest;
		}
		else
		{
			static int LK_Ops[] = { OP_LK, OP_LKF, OP_LKS, OP_LKP };
			assert(start.RegType == ValueType->GetRegType());
			ExpEmit dest(build, start.RegType);
			build->Emit(LK_Ops[start.RegType], dest.RegNum, start.RegNum + indexval);
			return dest;
		}
	}
	else
	{
		ExpEmit indexv(index->Emit(build));
		// Todo: For dynamically allocated arrays (like global sector and linedef tables) we need to get the bound value in here somehow.
		// Right now their bounds are not properly checked for.
		if (arraytype->ElementCount > 65535)
		{
			build->Emit(OP_BOUND_K, indexv.RegNum, build->GetConstantInt(arraytype->ElementCount));
		}
		else
		{
			build->Emit(OP_BOUND, indexv.RegNum, arraytype->ElementCount);
		}

		if (!start.Konst)
		{
			int shiftbits = 0;
			while (1u << shiftbits < arraytype->ElementSize)
			{
				shiftbits++;
			}
			ExpEmit indexwork = indexv.Fixed && arraytype->ElementSize > 1 ? ExpEmit(build, indexv.RegType) : indexv;
			if (1u << shiftbits == arraytype->ElementSize)
			{
				if (shiftbits > 0)
				{
					build->Emit(OP_SLL_RI, indexwork.RegNum, indexv.RegNum, shiftbits);
				}
			}
			else
			{
				// A shift won't do, so use a multiplication
				build->Emit(OP_MUL_RK, indexwork.RegNum, indexv.RegNum, build->GetConstantInt(arraytype->ElementSize));
			}
			indexwork.Free(build);

			if (AddressRequested)
			{
				if (!start.Fixed)
				{
					build->Emit(OP_ADDA_RR, start.RegNum, start.RegNum, indexwork.RegNum);
				}
				else
				{
					start.Free(build);
					// do not clobber local variables.
					ExpEmit temp(build, start.RegType);
					build->Emit(OP_ADDA_RR, temp.RegNum, start.RegNum, indexwork.RegNum);
					start = temp;
				}
				return start;
			}
			else
			{
				start.Free(build);
				ExpEmit dest(build, ValueType->GetRegType());
				// added 1 to use the *_R version that takes the offset from a register
				build->Emit(arraytype->ElementType->GetLoadOp() + 1, dest.RegNum, start.RegNum, indexwork.RegNum);
				return dest;
			}
		}
		else
		{
			static int LKR_Ops[] = { OP_LK_R, OP_LKF_R, OP_LKS_R, OP_LKP_R };
			assert(start.RegType == ValueType->GetRegType());
			ExpEmit dest(build, start.RegType);
			if (start.RegNum <= 255)
			{
				// Since large constant tables are the exception, the constant component in C is an immediate value here.
				build->Emit(LKR_Ops[start.RegType], dest.RegNum, indexv.RegNum, start.RegNum);
			}
			else
			{
				build->Emit(OP_ADD_RK, indexv.RegNum, indexv.RegNum, build->GetConstantInt(start.RegNum));
				build->Emit(LKR_Ops[start.RegType], dest.RegNum, indexv.RegNum, 0);
			}
			indexv.Free(build);
			return dest;
		}
	}
}